

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_crop.c
# Opt level: O3

gdImagePtr gdImageCropThreshold(gdImagePtr im,uint color,float threshold)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  gdImagePtr pgVar6;
  int iVar7;
  int iVar8;
  int x;
  gdRect local_48;
  ulong local_38;
  
  x = im->sx;
  iVar8 = im->sy;
  local_48.width = 0;
  local_48.x = 0;
  local_48.y = 0;
  if (100.0 < threshold) {
LAB_00113722:
    pgVar6 = (gdImagePtr)0x0;
  }
  else {
    if (iVar8 < 1) {
      iVar7 = iVar8 + -1;
      local_48.x = 0;
      local_48.y = -1;
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        iVar4 = iVar3;
        if (x < 1) {
          bVar2 = true;
        }
        else {
          iVar7 = 1;
          do {
            iVar3 = gdImageGetPixel(im,iVar7 + -1,iVar4);
            iVar3 = gdColorMatch(im,color,iVar3,threshold);
            bVar2 = 0 < iVar3;
            if (iVar3 < 1) break;
            bVar1 = iVar7 < x;
            iVar7 = iVar7 + 1;
          } while (bVar1);
        }
        iVar3 = iVar4 + 1;
      } while ((bVar2) && (iVar3 < iVar8));
      if (iVar3 == iVar8 + -1) goto LAB_00113722;
      iVar7 = iVar8 + -1;
      local_48.y = iVar4;
      iVar4 = iVar8;
      do {
        iVar5 = iVar7;
        iVar7 = iVar5;
        if (iVar4 < 1) break;
        if (x < 1) {
          bVar2 = true;
        }
        else {
          iVar7 = 1;
          do {
            iVar4 = gdImageGetPixel(im,iVar7 + -1,iVar5);
            iVar4 = gdColorMatch(im,color,iVar4,threshold);
            bVar2 = 0 < iVar4;
            if (iVar4 < 1) break;
            bVar1 = iVar7 < x;
            iVar7 = iVar7 + 1;
          } while (bVar1);
        }
        iVar7 = iVar5 + -1;
        iVar4 = iVar5;
      } while (bVar2);
    }
    local_48.height = (iVar8 - iVar3) + 2;
    if (iVar7 != 0) {
      local_48.height = (iVar7 - iVar3) + 3;
    }
    if (x < 1) {
      local_48.x = -1;
      iVar8 = 0;
    }
    else {
      iVar7 = local_48.height + iVar3 + -2;
      iVar8 = 0;
      local_38 = (ulong)(uint)local_48.height;
      do {
        iVar4 = iVar8;
        if (iVar7 < 1) {
          bVar2 = true;
        }
        else {
          iVar8 = 1;
          do {
            iVar5 = gdImageGetPixel(im,iVar4,iVar8 + -1);
            iVar5 = gdColorMatch(im,color,iVar5,threshold);
            bVar2 = 0 < iVar5;
            if (iVar5 < 1) break;
            bVar1 = iVar8 < iVar7;
            iVar8 = iVar8 + 1;
          } while (bVar1);
        }
        iVar8 = iVar4 + 1;
      } while ((bVar2) && (iVar8 < x));
      local_48.x = iVar4;
      if (0 < x) {
        iVar3 = iVar3 + (int)local_38 + -2;
        iVar7 = x;
        do {
          x = iVar7 + -1;
          if (iVar3 < 1) {
            bVar2 = true;
          }
          else {
            iVar4 = 1;
            do {
              iVar5 = gdImageGetPixel(im,x,iVar4 + -1);
              iVar5 = gdColorMatch(im,color,iVar5,threshold);
              bVar2 = 0 < iVar5;
              if (iVar5 < 1) break;
              bVar1 = iVar4 < iVar3;
              iVar4 = iVar4 + 1;
            } while (bVar1);
          }
        } while ((bVar2) && (bVar2 = 1 < iVar7, iVar7 = x, bVar2));
      }
    }
    local_48.width = (x - iVar8) + 2;
    pgVar6 = gdImageCrop(im,&local_48);
  }
  return pgVar6;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCropThreshold(gdImagePtr im, const unsigned int color, const float threshold)
{
	const int width = gdImageSX(im);
	const int height = gdImageSY(im);

	int x,y;
	int match;
	gdRect crop;

	crop.x = 0;
	crop.y = 0;
	crop.width = 0;
	crop.height = 0;

	/* Pierre: crop everything sounds bad */
	if (threshold > 100.0) {
		return NULL;
	}

	/* TODO: Add gdImageGetRowPtr and works with ptr at the row level
	 * for the true color and palette images
	 * new formats will simply work with ptr
	 */
	match = 1;
	for (y = 0; match && y < height; y++) {
		for (x = 0; match && x < width; x++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}

	/* Pierre
	 * Nothing to do > bye
	 * Duplicate the image?
	 */
	if (y == height - 1) {
		return NULL;
	}

	crop.y = y -1;
	match = 1;
	for (y = height - 1; match && y >= 0; y--) {
		for (x = 0; match && x < width; x++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x, y), threshold)) > 0;
		}
	}

	if (y == 0) {
		crop.height = height - crop.y + 1;
	} else {
		crop.height = y - crop.y + 2;
	}

	match = 1;
	for (x = 0; match && x < width; x++) {
		for (y = 0; match && y < crop.y + crop.height - 1; y++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}
	crop.x = x - 1;

	match = 1;
	for (x = width - 1; match && x >= 0; x--) {
		for (y = 0; match &&  y < crop.y + crop.height - 1; y++) {
			match = (gdColorMatch(im, color, gdImageGetPixel(im, x,y), threshold)) > 0;
		}
	}
	crop.width = x - crop.x + 2;

	return gdImageCrop(im, &crop);
}